

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O1

TIntermAggregate * __thiscall
glslang::TIntermediate::makeAggregate(TIntermediate *this,TIntermNode *node)

{
  iterator __position;
  int iVar1;
  TPoolAllocator *this_00;
  TIntermAggregate *this_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TIntermNode *local_10;
  vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *this_02;
  
  if (node == (TIntermNode *)0x0) {
    this_01 = (TIntermAggregate *)0x0;
  }
  else {
    local_10 = node;
    this_00 = GetThreadPoolAllocator();
    this_01 = (TIntermAggregate *)TPoolAllocator::allocate(this_00,0x188);
    TIntermAggregate::TIntermAggregate(this_01);
    iVar1 = (*(this_01->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x32])(this_01);
    this_02 = (vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
              CONCAT44(extraout_var,iVar1);
    __position._M_current = *(TIntermNode ***)(this_02 + 0x10);
    if (__position._M_current == *(TIntermNode ***)(this_02 + 0x18)) {
      std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
      _M_realloc_insert<TIntermNode*const&>(this_02,__position,&local_10);
    }
    else {
      *__position._M_current = local_10;
      *(long *)(this_02 + 0x10) = *(long *)(this_02 + 0x10) + 8;
    }
    iVar1 = (**local_10->_vptr_TIntermNode)();
    (*(this_01->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[1])
              (this_01,CONCAT44(extraout_var_00,iVar1));
  }
  return this_01;
}

Assistant:

TIntermAggregate* TIntermediate::makeAggregate(TIntermNode* node)
{
    if (node == nullptr)
        return nullptr;

    TIntermAggregate* aggNode = new TIntermAggregate;
    aggNode->getSequence().push_back(node);
    aggNode->setLoc(node->getLoc());

    return aggNode;
}